

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_binding.cpp
# Opt level: O3

void lumeview::ImGui_NewFrame(void)

{
  undefined8 uVar1;
  bool bVar2;
  ImGuiIO *pIVar3;
  ivec4 *piVar4;
  long lVar5;
  int i;
  ImVec2 IVar6;
  
  if (g_FontTexture == 0) {
    ImGui_CreateDeviceObjects();
  }
  pIVar3 = ImGui::GetIO();
  piVar4 = WindowEventListener::viewport((WindowEventListener *)g_eventListener);
  uVar1 = *(undefined8 *)((long)&piVar4->field_0 + 8);
  IVar6.x = (float)((int)uVar1 - (int)*(undefined8 *)&piVar4->field_0);
  IVar6.y = (float)((int)((ulong)uVar1 >> 0x20) -
                   (int)((ulong)*(undefined8 *)&piVar4->field_0 >> 0x20));
  pIVar3->DisplaySize = IVar6;
  (pIVar3->DisplayFramebufferScale).x = 1.0;
  (pIVar3->DisplayFramebufferScale).y = 1.0;
  lVar5 = std::chrono::_V2::steady_clock::now();
  pIVar3->DeltaTime = (float)(lVar5 - _ZN8lumeviewL6g_TimeE_0) / 1e+09;
  _ZN8lumeviewL6g_TimeE_0 = lVar5;
  IVar6 = (ImVec2)WindowEventListener::cursor_position((WindowEventListener *)g_eventListener);
  pIVar3->MousePos = IVar6;
  lVar5 = 0;
  do {
    bVar2 = WindowEventListener::mouse_button_is_down
                      ((WindowEventListener *)g_eventListener,(int)lVar5);
    pIVar3->MouseDown[lVar5] = bVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  ImGui::NewFrame();
  return;
}

Assistant:

void ImGui_NewFrame()
{
    if (!g_FontTexture)
        ImGui_CreateDeviceObjects();

    ImGuiIO& io = ImGui::GetIO();

    const glm::ivec4 vp = g_eventListener.viewport();
    io.DisplaySize = ImVec2(float(vp.z - vp.x), float(vp.w - vp.y));
	io.DisplayFramebufferScale = ImVec2(1.f, 1.f);


    // Setup time step
    const auto curTime =  clock::now();
    io.DeltaTime = chrono::duration <float> (curTime - g_Time).count();
    g_Time = curTime;

    // Setip mouse
	const glm::vec2 cursorPos = g_eventListener.cursor_position();
	io.MousePos = ImVec2(cursorPos.x, cursorPos.y);

    for (int i = 0; i < 3; i++)
        io.MouseDown[i] = g_eventListener.mouse_button_is_down (i);

    // // Update OS/hardware mouse cursor if imgui isn't drawing a software cursor
    // if ((io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange) == 0 && glfwGetInputMode(g_Window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
    // {
    //     ImGuiMouseCursor cursor = ImGui::GetMouseCursor();
    //     if (io.MouseDrawCursor || cursor == ImGuiMouseCursor_None)
    //     {
    //         glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
    //     }
    //     else
    //     {
    //         glfwSetCursor(g_Window, g_MouseCursors[cursor] ? g_MouseCursors[cursor] : g_MouseCursors[ImGuiMouseCursor_Arrow]);
    //         glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
    //     }
    // }

    // // Gamepad navigation mapping [BETA]
    // memset(io.NavInputs, 0, sizeof(io.NavInputs));
    // if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)
    // {
    //     // Update gamepad inputs
    //     #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
    //     #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
    //     int axes_count = 0, buttons_count = 0;
    //     const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
    //     const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
    //     MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
    //     MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
    //     MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
    //     MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
    //     MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
    //     MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
    //     MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
    //     MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
    //     MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
    //     MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
    //     MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
    //     MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
    //     MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
    //     MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
    //     MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
    //     MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
    //     #undef MAP_BUTTON
    //     #undef MAP_ANALOG
    //     if (axes_count > 0 && buttons_count > 0) 
    //         io.BackendFlags |= ImGuiBackendFlags_HasGamepad; 
    //     else 
    //         io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    // }

    // Start the frame. This call will update the io.WantCaptureMouse, io.WantCaptureKeyboard flag that you can use to dispatch inputs (or not) to your application.
    ImGui::NewFrame();
}